

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::BeginCombo(char *label,char *preview_value,ImGuiComboFlags flags)

{
  ImDrawCornerFlags rounding_corners;
  undefined1 auVar1 [16];
  ImGuiContext *pIVar2;
  ImGuiID id;
  bool bVar3;
  bool bVar4;
  ImU32 IVar5;
  ImGuiWindow *pIVar6;
  ImGuiContext *g;
  uint items_count;
  uint uVar7;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar8;
  ImVec2 IVar9;
  ulong extraout_XMM0_Qb;
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar18 [16];
  undefined1 auVar19 [64];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar23;
  ImRect IVar24;
  bool hovered;
  float local_f8;
  float local_f4;
  ImGuiID local_f0;
  bool held;
  ImRect frame_bb;
  float local_d8;
  char name [16];
  float local_98;
  float local_88;
  ImVec2 local_68;
  ImRect r_outer;
  ImVec2 size_expected;
  ImVec2 pos;
  ImRect total_bb;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [56];
  undefined1 auVar17 [56];
  undefined1 extraout_var_01 [56];
  undefined1 auVar20 [56];
  
  pIVar2 = GImGui;
  uVar7 = (GImGui->NextWindowData).Flags;
  (GImGui->NextWindowData).Flags = uVar7 & 0xffffffef;
  pIVar6 = pIVar2->CurrentWindow;
  pIVar6->WriteAccessed = true;
  if (pIVar6->SkipItems != false) {
    return false;
  }
  if ((~flags & 0x60U) == 0) {
    __assert_fail("(flags & (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)) != (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_widgets.cpp"
                  ,0x617,"bool ImGui::BeginCombo(const char *, const char *, ImGuiComboFlags)");
  }
  local_f0 = ImGuiWindow::GetID(pIVar6,label,(char *)0x0);
  local_f8 = 0.0;
  if ((flags & 0x20U) == 0) {
    local_f8 = GetFrameHeight();
  }
  IVar9 = CalcTextSize(label,(char *)0x0,true,-1.0);
  local_88 = IVar9.x;
  auVar13._0_4_ = CalcItemWidth();
  auVar13._4_60_ = extraout_var;
  auVar10 = ZEXT416((uint)local_f8);
  if ((flags & 0x40U) == 0) {
    auVar10 = auVar13._0_16_;
  }
  auVar1._8_8_ = extraout_XMM0_Qb;
  auVar1._0_4_ = IVar9.x;
  auVar1._4_4_ = IVar9.y;
  auVar1 = vmovshdup_avx(auVar1);
  fVar8 = (pIVar2->Style).FramePadding.y;
  IVar9 = (pIVar6->DC).CursorPos;
  auVar11._8_8_ = 0;
  auVar11._0_4_ = IVar9.x;
  auVar11._4_4_ = IVar9.y;
  auVar1 = vinsertps_avx(auVar10,ZEXT416((uint)(fVar8 + fVar8 + auVar1._0_4_)),0x10);
  auVar21._0_4_ = auVar1._0_4_ + IVar9.x;
  auVar21._4_4_ = auVar1._4_4_ + IVar9.y;
  auVar21._8_4_ = auVar1._8_4_ + 0.0;
  auVar21._12_4_ = auVar1._12_4_ + 0.0;
  frame_bb = (ImRect)vmovlhps_avx(auVar11,auVar21);
  fVar23 = 0.0;
  if (0.0 < local_88) {
    fVar23 = local_88 + (pIVar2->Style).ItemInnerSpacing.x;
  }
  auVar22._0_4_ = fVar23 + auVar21._0_4_;
  auVar22._4_4_ = auVar21._4_4_ + 0.0;
  auVar22._8_4_ = auVar21._8_4_ + 0.0;
  auVar22._12_4_ = auVar21._12_4_ + 0.0;
  total_bb = (ImRect)vmovlhps_avx(auVar11,auVar22);
  ItemSize(&total_bb,fVar8);
  id = local_f0;
  bVar3 = ItemAdd(&total_bb,local_f0,&frame_bb);
  if (!bVar3) {
    return false;
  }
  bVar3 = ButtonBehavior(&frame_bb,id,&hovered,&held,0);
  bVar4 = IsPopupOpen(id,0);
  IVar5 = GetColorU32(hovered + 7,1.0);
  auVar11 = ZEXT416((uint)frame_bb.Min.x);
  local_f4 = frame_bb.Max.x;
  RenderNavHighlight(&frame_bb,id,1);
  auVar1 = vcmpss_avx(ZEXT416((uint)(local_f4 - local_f8)),auVar11,2);
  auVar1 = vblendvps_avx(ZEXT416((uint)(local_f4 - local_f8)),auVar11,auVar1);
  local_d8 = auVar1._0_4_;
  if ((flags & 0x40U) == 0) {
    name._4_4_ = frame_bb.Max.y;
    name._0_4_ = local_d8;
    rounding_corners = 0xf;
    if ((flags & 0x20U) == 0) {
      rounding_corners = 5;
    }
    ImDrawList::AddRectFilled
              (pIVar6->DrawList,&frame_bb.Min,(ImVec2 *)name,IVar5,(pIVar2->Style).FrameRounding,
               rounding_corners);
  }
  local_98 = auVar10._0_4_;
  if ((flags & 0x20U) == 0) {
    IVar5 = GetColorU32(((byte)(hovered | bVar4) & 1) + 0x15,1.0);
    local_f4 = (float)GetColorU32(0,1.0);
    name._4_4_ = frame_bb.Min.y;
    name._0_4_ = local_d8;
    ImDrawList::AddRectFilled
              (pIVar6->DrawList,(ImVec2 *)name,&frame_bb.Max,IVar5,(pIVar2->Style).FrameRounding,
               (uint)(local_98 <= local_f8) * 5 + 10);
    if ((local_f8 + local_d8) - (pIVar2->Style).FramePadding.x <= frame_bb.Max.x) {
      fVar8 = (pIVar2->Style).FramePadding.y;
      auVar1 = vinsertps_avx(ZEXT416((uint)(fVar8 + local_d8)),
                             ZEXT416((uint)(fVar8 + frame_bb.Min.y)),0x10);
      RenderArrow(pIVar6->DrawList,auVar1._0_8_,(ImU32)local_f4,3,1.0);
    }
  }
  RenderFrameBorder(frame_bb.Min,frame_bb.Max,(pIVar2->Style).FrameRounding);
  if (preview_value != (char *)0x0 && (char)((flags & 0x40U) >> 6) == '\0') {
    IVar9 = (pIVar2->Style).FramePadding;
    auVar12._0_4_ = frame_bb.Min.x + IVar9.x;
    auVar12._4_4_ = frame_bb.Min.y + IVar9.y;
    auVar12._8_8_ = 0;
    name._0_8_ = vmovlps_avx(auVar12);
    if (pIVar2->LogEnabled == true) {
      LogSetNextTextDecoration("{","}");
    }
    r_outer.Min.y = frame_bb.Max.y;
    r_outer.Min.x = local_d8;
    size_expected.x = 0.0;
    size_expected.y = 0.0;
    RenderTextClipped((ImVec2 *)name,&r_outer.Min,preview_value,(char *)0x0,(ImVec2 *)0x0,
                      &size_expected,(ImRect *)0x0);
  }
  IVar24 = frame_bb;
  auVar20 = ZEXT856(extraout_XMM0_Qb);
  if (0.0 < local_88) {
    auVar1 = vinsertps_avx(ZEXT416((uint)(pIVar2->Style).FramePadding.y),
                           ZEXT416((uint)(pIVar2->Style).ItemInnerSpacing.x),0x10);
    auVar18._8_8_ = 0;
    auVar18._0_4_ = frame_bb.Min.y;
    auVar18._4_4_ = frame_bb.Max.x;
    auVar1 = vshufps_avx(auVar1,auVar1,0xe1);
    auVar11 = vshufps_avx(auVar18,auVar18,0xe1);
    auVar20 = ZEXT856(auVar11._8_8_);
    IVar9.x = auVar11._0_4_ + auVar1._0_4_;
    IVar9.y = auVar11._4_4_ + auVar1._4_4_;
    frame_bb = IVar24;
    RenderText(IVar9,label,(char *)0x0,true);
  }
  if (bVar3) {
    if (bVar4) goto LAB_0015ed32;
  }
  else if (pIVar2->NavActivateId != local_f0 || bVar4) {
    if (!bVar4) {
      return false;
    }
    goto LAB_0015ed32;
  }
  if ((pIVar6->DC).NavLayerCurrent == ImGuiNavLayer_Main) {
    pIVar6->NavLastIds[0] = local_f0;
  }
  OpenPopupEx(local_f0,0);
LAB_0015ed32:
  if ((uVar7 & 0x10) == 0) {
    uVar7 = flags | 4;
    if ((flags & 0x1eU) != 0) {
      uVar7 = flags;
    }
    if (POPCOUNT(uVar7 & 0x1e) != 1) {
      __assert_fail("ImIsPowerOfTwo(flags & ImGuiComboFlags_HeightMask_)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_widgets.cpp"
                    ,0x656,"bool ImGui::BeginCombo(const char *, const char *, ImGuiComboFlags)");
    }
    if ((uVar7 & 4) == 0) {
      if ((uVar7 & 2) == 0) {
        items_count = -(uint)((uVar7 & 8) == 0) | 0x14;
      }
      else {
        items_count = 4;
      }
    }
    else {
      items_count = 8;
    }
    name[4] = '\0';
    name[5] = '\0';
    name[6] = '\0';
    name[7] = '\0';
    name._0_4_ = local_98;
    fVar8 = CalcMaxPopupHeightFromItemCount(items_count);
    r_outer.Min.y = fVar8;
    r_outer.Min.x = 3.4028235e+38;
    SetNextWindowSizeConstraints((ImVec2 *)name,&r_outer.Min,(ImGuiSizeCallback)0x0,(void *)0x0);
    flags = uVar7;
  }
  else {
    *(byte *)&(pIVar2->NextWindowData).Flags = (byte)(pIVar2->NextWindowData).Flags | 0x10;
    auVar11 = ZEXT416((uint)(pIVar2->NextWindowData).SizeConstraintRect.Min.x);
    auVar1 = vcmpss_avx(auVar10,auVar11,2);
    auVar20 = ZEXT856(auVar1._8_8_);
    auVar10 = vblendvps_avx(auVar10,auVar11,auVar1);
    (pIVar2->NextWindowData).SizeConstraintRect.Min.x = auVar10._0_4_;
  }
  ImFormatString(name,0x10,"##Combo_%02d",(ulong)(uint)(pIVar2->BeginPopupStack).Size);
  pIVar6 = FindWindowByName(name);
  if ((pIVar6 != (ImGuiWindow *)0x0) && (pIVar6->WasActive == true)) {
    auVar14._0_8_ = CalcWindowNextAutoFitSize(pIVar6);
    auVar14._8_56_ = extraout_var_00;
    size_expected = (ImVec2)vmovlps_avx(auVar14._0_16_);
    pIVar6->AutoPosLastDirection = (uint)((flags & 1U) == 0) * 3;
    auVar17 = extraout_var_00;
    IVar24 = GetWindowAllowedExtentRect(pIVar6);
    auVar19._0_8_ = IVar24.Max;
    auVar19._8_56_ = auVar20;
    auVar15._0_8_ = IVar24.Min;
    auVar15._8_56_ = auVar17;
    r_outer = (ImRect)vmovlhps_avx(auVar15._0_16_,auVar19._0_16_);
    auVar10 = vinsertps_avx((undefined1  [16])frame_bb,ZEXT416((uint)frame_bb.Max.y),0x10);
    local_68 = (ImVec2)vmovlps_avx(auVar10);
    auVar16._0_8_ =
         FindBestWindowPosForPopupEx
                   (&local_68,&size_expected,&pIVar6->AutoPosLastDirection,&r_outer,&frame_bb,
                    ImGuiPopupPositionPolicy_ComboBox);
    auVar16._8_56_ = extraout_var_01;
    pos = (ImVec2)vmovlps_avx(auVar16._0_16_);
    local_68.x = 0.0;
    local_68.y = 0.0;
    SetNextWindowPos(&pos,0,&local_68);
  }
  r_outer.Min.y = (pIVar2->Style).WindowPadding.y;
  r_outer.Min.x = (pIVar2->Style).FramePadding.x;
  PushStyleVar(1,&r_outer.Min);
  bVar3 = Begin(name,(bool *)0x0,0x4000147);
  PopStyleVar(1);
  if (!bVar3) {
    EndPopup();
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_widgets.cpp"
                  ,0x67b,"bool ImGui::BeginCombo(const char *, const char *, ImGuiComboFlags)");
  }
  return true;
}

Assistant:

bool ImGui::BeginCombo(const char* label, const char* preview_value, ImGuiComboFlags flags)
{
    // Always consume the SetNextWindowSizeConstraint() call in our early return paths
    ImGuiContext& g = *GImGui;
    bool has_window_size_constraint = (g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasSizeConstraint) != 0;
    g.NextWindowData.Flags &= ~ImGuiNextWindowDataFlags_HasSizeConstraint;

    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    IM_ASSERT((flags & (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)) != (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)); // Can't use both flags together

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);

    const float arrow_size = (flags & ImGuiComboFlags_NoArrowButton) ? 0.0f : GetFrameHeight();
    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    const float expected_w = CalcItemWidth();
    const float w = (flags & ImGuiComboFlags_NoPreview) ? arrow_size : expected_w;
    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(w, label_size.y + style.FramePadding.y * 2.0f));
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0.0f));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, id, &frame_bb))
        return false;

    bool hovered, held;
    bool pressed = ButtonBehavior(frame_bb, id, &hovered, &held);
    bool popup_open = IsPopupOpen(id, ImGuiPopupFlags_None);

    const ImU32 frame_col = GetColorU32(hovered ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg);
    const float value_x2 = ImMax(frame_bb.Min.x, frame_bb.Max.x - arrow_size);
    RenderNavHighlight(frame_bb, id);
    if (!(flags & ImGuiComboFlags_NoPreview))
        window->DrawList->AddRectFilled(frame_bb.Min, ImVec2(value_x2, frame_bb.Max.y), frame_col, style.FrameRounding, (flags & ImGuiComboFlags_NoArrowButton) ? ImDrawCornerFlags_All : ImDrawCornerFlags_Left);
    if (!(flags & ImGuiComboFlags_NoArrowButton))
    {
        ImU32 bg_col = GetColorU32((popup_open || hovered) ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
        ImU32 text_col = GetColorU32(ImGuiCol_Text);
        window->DrawList->AddRectFilled(ImVec2(value_x2, frame_bb.Min.y), frame_bb.Max, bg_col, style.FrameRounding, (w <= arrow_size) ? ImDrawCornerFlags_All : ImDrawCornerFlags_Right);
        if (value_x2 + arrow_size - style.FramePadding.x <= frame_bb.Max.x)
            RenderArrow(window->DrawList, ImVec2(value_x2 + style.FramePadding.y, frame_bb.Min.y + style.FramePadding.y), text_col, ImGuiDir_Down, 1.0f);
    }
    RenderFrameBorder(frame_bb.Min, frame_bb.Max, style.FrameRounding);
    if (preview_value != NULL && !(flags & ImGuiComboFlags_NoPreview))
    {
        ImVec2 preview_pos = frame_bb.Min + style.FramePadding;
        if (g.LogEnabled)
            LogSetNextTextDecoration("{", "}");
        RenderTextClipped(preview_pos, ImVec2(value_x2, frame_bb.Max.y), preview_value, NULL, NULL, ImVec2(0.0f, 0.0f));
    }
    if (label_size.x > 0)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, frame_bb.Min.y + style.FramePadding.y), label);

    if ((pressed || g.NavActivateId == id) && !popup_open)
    {
        if (window->DC.NavLayerCurrent == 0)
            window->NavLastIds[0] = id;
        OpenPopupEx(id, ImGuiPopupFlags_None);
        popup_open = true;
    }

    if (!popup_open)
        return false;

    if (has_window_size_constraint)
    {
        g.NextWindowData.Flags |= ImGuiNextWindowDataFlags_HasSizeConstraint;
        g.NextWindowData.SizeConstraintRect.Min.x = ImMax(g.NextWindowData.SizeConstraintRect.Min.x, w);
    }
    else
    {
        if ((flags & ImGuiComboFlags_HeightMask_) == 0)
            flags |= ImGuiComboFlags_HeightRegular;
        IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiComboFlags_HeightMask_));    // Only one
        int popup_max_height_in_items = -1;
        if (flags & ImGuiComboFlags_HeightRegular)     popup_max_height_in_items = 8;
        else if (flags & ImGuiComboFlags_HeightSmall)  popup_max_height_in_items = 4;
        else if (flags & ImGuiComboFlags_HeightLarge)  popup_max_height_in_items = 20;
        SetNextWindowSizeConstraints(ImVec2(w, 0.0f), ImVec2(FLT_MAX, CalcMaxPopupHeightFromItemCount(popup_max_height_in_items)));
    }

    char name[16];
    ImFormatString(name, IM_ARRAYSIZE(name), "##Combo_%02d", g.BeginPopupStack.Size); // Recycle windows based on depth

    // Position the window given a custom constraint (peak into expected window size so we can position it)
    // This might be easier to express with an hypothetical SetNextWindowPosConstraints() function.
    if (ImGuiWindow* popup_window = FindWindowByName(name))
        if (popup_window->WasActive)
        {
            // Always override 'AutoPosLastDirection' to not leave a chance for a past value to affect us.
            ImVec2 size_expected = CalcWindowNextAutoFitSize(popup_window);
            if (flags & ImGuiComboFlags_PopupAlignLeft)
                popup_window->AutoPosLastDirection = ImGuiDir_Left; // "Below, Toward Left"
            else
                popup_window->AutoPosLastDirection = ImGuiDir_Down; // "Below, Toward Right (default)"
            ImRect r_outer = GetWindowAllowedExtentRect(popup_window);
            ImVec2 pos = FindBestWindowPosForPopupEx(frame_bb.GetBL(), size_expected, &popup_window->AutoPosLastDirection, r_outer, frame_bb, ImGuiPopupPositionPolicy_ComboBox);
            SetNextWindowPos(pos);
        }

    // We don't use BeginPopupEx() solely because we have a custom name string, which we could make an argument to BeginPopupEx()
    ImGuiWindowFlags window_flags = ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_Popup | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_NoMove;

    // Horizontally align ourselves with the framed text
    PushStyleVar(ImGuiStyleVar_WindowPadding, ImVec2(style.FramePadding.x, style.WindowPadding.y));
    bool ret = Begin(name, NULL, window_flags);
    PopStyleVar();
    if (!ret)
    {
        EndPopup();
        IM_ASSERT(0);   // This should never happen as we tested for IsPopupOpen() above
        return false;
    }
    return true;
}